

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmio.c
# Opt level: O3

int mm_read_unsymmetric_sparse(char *fname,int *M_,int *N_,int *nz_,double **val_,int **I_,int **J_)

{
  int iVar1;
  FILE *__stream;
  int *piVar2;
  int *piVar3;
  double *pdVar4;
  int iVar5;
  long lVar6;
  int N;
  int M;
  char local_50;
  char local_4f;
  char local_4e;
  int local_4c;
  int local_48;
  int local_44;
  double **local_40;
  int **local_38;
  
  local_40 = val_;
  local_38 = I_;
  __stream = fopen(fname,"r");
  iVar5 = -1;
  if (__stream != (FILE *)0x0) {
    iVar1 = mm_read_banner((FILE *)__stream,(MM_typecode *)&local_50);
    if (iVar1 == 0) {
      if (((local_4e == 'R') && (local_50 == 'M')) && (local_4f == 'C')) {
        iVar1 = mm_read_mtx_crd_size((FILE *)__stream,&local_44,&local_48,&local_4c);
        if (iVar1 == 0) {
          *M_ = local_44;
          *N_ = local_48;
          lVar6 = (long)local_4c;
          *nz_ = local_4c;
          piVar2 = (int *)malloc(lVar6 * 4);
          piVar3 = (int *)malloc(lVar6 * 4);
          pdVar4 = (double *)malloc(lVar6 * 8);
          *local_40 = pdVar4;
          *local_38 = piVar2;
          *J_ = piVar3;
          if (0 < lVar6) {
            lVar6 = 0;
            do {
              __isoc99_fscanf(__stream,"%d %d %lg\n",piVar2,piVar3,pdVar4);
              *piVar2 = *piVar2 + -1;
              *piVar3 = *piVar3 + -1;
              lVar6 = lVar6 + 1;
              pdVar4 = pdVar4 + 1;
              piVar3 = piVar3 + 1;
              piVar2 = piVar2 + 1;
            } while (lVar6 < local_4c);
          }
          fclose(__stream);
          iVar5 = 0;
        }
        else {
          mm_read_unsymmetric_sparse_cold_2();
        }
      }
      else {
        mm_read_unsymmetric_sparse_cold_1();
      }
    }
    else {
      printf("mm_read_unsymetric: Could not process Matrix Market banner ");
      printf(" in file [%s]\n",fname);
    }
  }
  return iVar5;
}

Assistant:

int mm_read_unsymmetric_sparse(const char *fname, int *M_, int *N_, int *nz_,
                               double **val_, int **I_, int **J_) {
    FILE *f;
    MM_typecode matcode;
    int M, N, nz;
    int i;
    double *val;
    int *I, *J;

    if ((f = fopen(fname, "r")) == NULL)
        return -1;


    if (mm_read_banner(f, &matcode) != 0) {
        printf("mm_read_unsymetric: Could not process Matrix Market banner ");
        printf(" in file [%s]\n", fname);
        return -1;
    }


    if (!(mm_is_real(matcode) && mm_is_matrix(matcode) &&
          mm_is_sparse(matcode))) {
        fprintf(stderr, "Sorry, this application does not support ");
        fprintf(stderr, "Market Market type: [%s]\n",
                mm_typecode_to_str(matcode));
        return -1;
    }

    /* find out size of sparse matrix: M, N, nz .... */

    if (mm_read_mtx_crd_size(f, &M, &N, &nz) != 0) {
        fprintf(stderr, "read_unsymmetric_sparse(): could not parse matrix size.\n");
        return -1;
    }

    *M_ = M;
    *N_ = N;
    *nz_ = nz;

    /* reseve memory for matrices */

    I = (int *) malloc(nz * sizeof(int));
    J = (int *) malloc(nz * sizeof(int));
    val = (double *) malloc(nz * sizeof(double));

    *val_ = val;
    *I_ = I;
    *J_ = J;

    /* NOTE: when reading in doubles, ANSI C requires the use of the "l"  */
    /*   specifier as in "%lg", "%lf", "%le", otherwise errors will occur */
    /*  (ANSI C X3.159-1989, Sec. 4.9.6.2, p. 136 lines 13-15)            */

    for (i = 0; i < nz; i++) {
        fscanf(f, "%d %d %lg\n", &I[i], &J[i], &val[i]);
        I[i]--;  /* adjust from 1-based to 0-based */
        J[i]--;
    }
    fclose(f);

    return 0;
}